

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O0

void __thiscall
TPZReducedSpace::CreateGraphicalElement(TPZReducedSpace *this,TPZGraphMesh *grmesh,int dimension)

{
  bool bVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  long *plVar4;
  TPZGraphElT3d *this_00;
  TPZCompEl *cel;
  TPZGraphMesh *gg;
  int in_EDX;
  long *in_RDI;
  bool to_postpro;
  int nsides;
  int matid;
  TPZGeoEl *ref;
  TPZGraphMesh *in_stack_ffffffffffffff80;
  TPZCompEl *in_stack_ffffffffffffff88;
  TPZGraphMesh *in_stack_ffffffffffffff90;
  
  pTVar3 = TPZCompEl::Reference(in_stack_ffffffffffffff88);
  plVar4 = (long *)(**(code **)(*in_RDI + 0xb8))();
  (**(code **)(*plVar4 + 0x58))();
  iVar2 = (**(code **)(*(long *)pTVar3 + 0xf0))();
  bVar1 = TPZGraphMesh::Material_Is_PostProcessed
                    (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  if ((in_EDX == 2) && (bVar1)) {
    if (iVar2 == 9) {
      operator_new(0x28);
      TPZGraphElQ2dd::TPZGraphElQ2dd
                ((TPZGraphElQ2dd *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80);
      return;
    }
    if (iVar2 == 7) {
      operator_new(0x28);
      TPZGraphElT2dMapped::TPZGraphElT2dMapped
                ((TPZGraphElT2dMapped *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80);
      return;
    }
  }
  if ((in_EDX == 3) && (bVar1)) {
    if (iVar2 == 0x1b) {
      operator_new(0x28);
      TPZGraphElQ3dd::TPZGraphElQ3dd
                ((TPZGraphElQ3dd *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80);
      return;
    }
    if (iVar2 == 0x15) {
      operator_new(0x28);
      TPZGraphElPrismMapped::TPZGraphElPrismMapped
                ((TPZGraphElPrismMapped *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80);
      return;
    }
    if (iVar2 == 0xf) {
      this_00 = (TPZGraphElT3d *)operator_new(0x28);
      TPZGraphElT3d::TPZGraphElT3d(this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      return;
    }
    if (iVar2 == 0x13) {
      cel = (TPZCompEl *)operator_new(0x28);
      TPZGraphElPyramidMapped::TPZGraphElPyramidMapped
                ((TPZGraphElPyramidMapped *)in_stack_ffffffffffffff90,cel,in_stack_ffffffffffffff80)
      ;
      return;
    }
  }
  if ((in_EDX == 1) && (bVar1)) {
    gg = (TPZGraphMesh *)operator_new(0x28);
    TPZGraphEl1dd::TPZGraphEl1dd
              ((TPZGraphEl1dd *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,gg);
  }
  return;
}

Assistant:

void TPZReducedSpace::CreateGraphicalElement(TPZGraphMesh &grmesh, int dimension) {
	TPZGeoEl *ref = Reference();
	int matid = Material()->Id();
	int nsides = ref->NSides();
    bool to_postpro = grmesh.Material_Is_PostProcessed(matid);
	if(dimension == 2 && to_postpro){
		if(nsides == 9){
			new TPZGraphElQ2dd(this,&grmesh);
			return;
		}
		if(nsides == 7){
			new TPZGraphElT2dMapped(this,&grmesh);
			return;
		}
	}//2d
	
	if(dimension == 3 && to_postpro){
		if(nsides == 27){
			new TPZGraphElQ3dd(this,&grmesh);
			return;
		}//cube
		if(nsides == 21){
			new TPZGraphElPrismMapped(this,&grmesh);
			return;
		}//prism
		if(nsides == 15){
			new TPZGraphElT3d(this,&grmesh);
			return;
		}//tetra
		if(nsides == 19){
			new TPZGraphElPyramidMapped(this,&grmesh);
			return;
		}//pyram
	}//3d
	
	if(dimension == 1 && to_postpro){
		new TPZGraphEl1dd(this,&grmesh);
	}//1d
}